

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::
insertNode(iterator *this,uint32_t level,NodeRef node,interval<unsigned_long> *key,
          allocator_type *alloc)

{
  Path *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  uint uVar4;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_01;
  pointer pEVar5;
  void *pvVar6;
  undefined8 uVar7;
  unsigned_long uVar8;
  uint32_t uVar9;
  uintptr_t intWord;
  IndexPair offset;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  this_00 = &(this->super_const_iterator).path;
  bVar13 = level == 1;
  if (bVar13) {
    this_01 = (this->super_const_iterator).map;
    uVar12 = this_01->rootSize;
    uVar4 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
            offset;
    if (uVar12 < 8) {
      while (uVar12 != uVar4) {
        uVar10 = (ulong)uVar12;
        uVar12 = uVar12 - 1;
        *(undefined8 *)((long)&this_01->field_0 + uVar10 * 8) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar12 * 8);
        puVar1 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar12 * 0x10 + 0x40);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&this_01->field_0 + uVar10 * 0x10 + 0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
      }
      *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)&this_01->field_0 + (ulong)uVar4 * 8)
           = node.pip.value;
      uVar8 = key->right;
      puVar3 = (unsigned_long *)((long)&this_01->field_0 + (ulong)uVar4 * 0x10 + 0x40);
      *puVar3 = key->left;
      puVar3[1] = uVar8;
      uVar9 = this_01->rootSize + 1;
      this_01->rootSize = uVar9;
      pEVar5 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar5->size = uVar9;
      uVar10 = *(ulong *)((long)pEVar5->node + (ulong)pEVar5->offset * 8);
      pEVar5[1].node = (void *)(uVar10 & 0xffffffffffffffc0);
      pEVar5[1].size = ((uint)uVar10 & 0x3f) + 1;
      return false;
    }
    offset = IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::
             modifyRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>,slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>,false>
                       ((IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u> *)
                        this_01,(BranchNode<unsigned_long,_8U,_true> *)this_01,uVar4,alloc);
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (this_00,(BranchNode<unsigned_long,_8U,_true> *)this_01,this_01->rootSize,offset);
    level = 2;
  }
  uVar12 = level - 1;
  uVar10 = (ulong)uVar12;
  IntervalMapDetails::Path::legalizeForInsert(this_00,uVar12);
  if ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[uVar10].
      size == 8) {
    bVar13 = IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::iterator::
             overflow<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((iterator *)this,uVar12,alloc);
    if (!bVar13) {
      level = uVar12;
    }
    uVar10 = (ulong)level;
  }
  pEVar5 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  pvVar6 = pEVar5[uVar10].node;
  uVar4 = pEVar5[uVar10].offset;
  uVar12 = pEVar5[uVar10].size;
  while (uVar12 != uVar4) {
    uVar11 = (ulong)uVar12;
    uVar12 = uVar12 - 1;
    *(undefined8 *)((long)pvVar6 + uVar11 * 8) = *(undefined8 *)((long)pvVar6 + (ulong)uVar12 * 8);
    puVar1 = (undefined8 *)((long)pvVar6 + (ulong)uVar12 * 0x10 + 0x40);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)pvVar6 + uVar11 * 0x10 + 0x40);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
  }
  ((PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)pvVar6 + (ulong)uVar4 * 8))->value =
       (uintptr_t)node.pip.value;
  uVar8 = key->right;
  puVar3 = (unsigned_long *)((long)pvVar6 + (ulong)uVar4 * 0x10 + 0x40);
  *puVar3 = key->left;
  puVar3[1] = uVar8;
  pEVar5 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar12 = pEVar5[uVar10].size;
  pEVar5[uVar10].size = uVar12 + 1;
  uVar9 = (uint32_t)uVar10;
  if (uVar10 != 0) {
    *(ulong *)((long)pEVar5[uVar9 - 1].node + (ulong)pEVar5[uVar9 - 1].offset * 8) =
         *(ulong *)((long)pEVar5[uVar9 - 1].node + (ulong)pEVar5[uVar9 - 1].offset * 8) &
         0xffffffffffffffc0 | (ulong)uVar12;
  }
  updateParentBounds(this,uVar9,key);
  pEVar5 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar10 = *(ulong *)((long)pEVar5[uVar10].node + (ulong)pEVar5[uVar10].offset * 8);
  pEVar5[uVar9 + 1].node = (void *)(uVar10 & 0xffffffffffffffc0);
  pEVar5[uVar9 + 1].size = ((uint)uVar10 & 0x3f) + 1;
  return bVar13;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}